

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O3

int __thiscall
bdHashSpace::search(bdHashSpace *this,bdNodeId *id,string *key,uint32_t maxAge,
                   list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  string local_48;
  
  iVar3 = std::
          _Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdHashSet>,_std::_Select1st<std::pair<const_bdNodeId,_bdHashSet>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
          ::find((_Rb_tree<bdNodeId,_std::pair<const_bdNodeId,_bdHashSet>,_std::_Select1st<std::pair<const_bdNodeId,_bdHashSet>_>,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->mHashTable)._M_t._M_impl.super__Rb_tree_header) {
    iVar2 = 1;
  }
  else {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + key->_M_string_length);
    iVar2 = bdHashSet::search((bdHashSet *)&iVar3._M_node[1]._M_right,&local_48,maxAge,entries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar2;
}

Assistant:

int 	bdHashSpace::search(bdNodeId *id, std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	it = mHashTable.find(*id);
	if (it == mHashTable.end()) 
	{
		/* no entry */
		return 1;
	}

	return it->second.search(key, maxAge, entries);
}